

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

int QInputDialog::getInt
              (QWidget *parent,QString *title,QString *label,int value,int min,int max,int step,
              bool *ok,WindowFlags flags)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QInputDialog *this;
  QInputDialog *pQVar4;
  QFlagsStorage<Qt::WindowType> in_ECX;
  QWidget *in_RDX;
  undefined4 in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  long in_stack_00000010;
  int ret;
  QAutoPointer<QInputDialog> dialog;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  Int local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QInputDialog *)operator_new(0x28);
  QInputDialog((QInputDialog *)CONCAT44(in_R9D,in_stack_ffffffffffffffb0),
               (QWidget *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (WindowFlags)in_ECX.i);
  QAutoPointer<QInputDialog>::QAutoPointer
            ((QAutoPointer<QInputDialog> *)this,
             (QInputDialog *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79dc51);
  QWidget::setWindowTitle(in_RDX,(QString *)CONCAT44(in_ECX.i,in_R8D));
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79dc68);
  setLabelText((QInputDialog *)in_RDX,(QString *)CONCAT44(in_ECX.i,in_R8D));
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79dc7f);
  setIntRange(this,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79dc99);
  setIntValue((QInputDialog *)CONCAT44(in_R9D,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac);
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79dcaf);
  setIntStep(this,in_stack_ffffffffffffff9c);
  pQVar4 = QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79dcc5);
  iVar3 = (**(code **)(*(long *)&(pQVar4->super_QDialog).super_QWidget + 0x1a8))();
  if (in_stack_00000010 != 0) {
    *(bool *)in_stack_00000010 = iVar3 != 0;
  }
  bVar2 = QAutoPointer::operator_cast_to_bool((QAutoPointer<QInputDialog> *)0x79dcff);
  local_28 = in_ECX.i;
  if ((bVar2) && (iVar3 != 0)) {
    QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79dd16);
    local_28 = intValue((QInputDialog *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  QAutoPointer<QInputDialog>::~QAutoPointer((QAutoPointer<QInputDialog> *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

int QInputDialog::getInt(QWidget *parent, const QString &title, const QString &label, int value,
                         int min, int max, int step, bool *ok, Qt::WindowFlags flags)
{
    QAutoPointer<QInputDialog> dialog(new QInputDialog(parent, flags));
    dialog->setWindowTitle(title);
    dialog->setLabelText(label);
    dialog->setIntRange(min, max);
    dialog->setIntValue(value);
    dialog->setIntStep(step);

    const int ret = dialog->exec();
    if (ok)
        *ok = !!ret;
    if (bool(dialog) && ret) {
        return dialog->intValue();
    } else {
        return value;
    }
}